

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

void cortex_m3_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  obj[1].tb_jmp_cache[0x5f3] =
       (TranslationBlock *)((ulong)obj[1].tb_jmp_cache[0x5f3] | 0x4000000220);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x410fc231;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x3184) = 8;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x3244) = 0x20000000030;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31dc) = 0x100000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 0;
  obj[1].tb_jmp_cache[0x638] = (TranslationBlock *)0x0;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x639) = 0;
  obj[1].tb_jmp_cache[0x634] = (TranslationBlock *)0x211100001141110;
  obj[1].tb_jmp_cache[0x635] = (TranslationBlock *)0x111111021112231;
  obj[1].tb_jmp_cache[0x636] = (TranslationBlock *)0x1310102;
  obj[1].tb_jmp_cache[0x637] = (TranslationBlock *)0x3000000000;
  return;
}

Assistant:

static void cortex_m3_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);
    set_feature(&cpu->env, ARM_FEATURE_V7);
    set_feature(&cpu->env, ARM_FEATURE_M);
    set_feature(&cpu->env, ARM_FEATURE_M_MAIN);
    cpu->midr = 0x410fc231;
    cpu->pmsav7_dregion = 8;
    cpu->id_pfr0 = 0x00000030;
    cpu->id_pfr1 = 0x00000200;
    cpu->isar.id_dfr0 = 0x00100000;
    cpu->id_afr0 = 0x00000000;
    cpu->isar.id_mmfr0 = 0x00000030;
    cpu->isar.id_mmfr1 = 0x00000000;
    cpu->isar.id_mmfr2 = 0x00000000;
    cpu->isar.id_mmfr3 = 0x00000000;
    cpu->isar.id_isar0 = 0x01141110;
    cpu->isar.id_isar1 = 0x02111000;
    cpu->isar.id_isar2 = 0x21112231;
    cpu->isar.id_isar3 = 0x01111110;
    cpu->isar.id_isar4 = 0x01310102;
    cpu->isar.id_isar5 = 0x00000000;
    cpu->isar.id_isar6 = 0x00000000;
}